

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test::
~EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test
          (EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test *this)

{
  EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test *this_local;
  
  ~EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test(this);
  operator_delete(this,0xf20);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       trySelectNextStockPileCardOnLeftButtonDownEvent)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount);
    expectGetStockPileCollider();
    acceptLeftButtonDownOnCoveredStockPileCards(mouseLeftButtonDownEvent);
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}